

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_function_queue.h
# Opt level: O3

optional<int> __thiscall
density::
conc_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
::try_consume_impl(conc_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                   *this,conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
                         *param_2,Struct *param_3)

{
  int iVar1;
  FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)> *pFVar2;
  void *pvVar3;
  consume_operation cons;
  consume_operation cStack_48;
  
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
  ::try_start_consume(&cStack_48,param_2);
  if (cStack_48.m_consume_operation.m_control == (ControlBlock *)0x0) {
    (this->m_queue).m_mutex.super___mutex_base._M_mutex.__align = 0;
  }
  else {
    pFVar2 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
             ::consume_operation::complete_type(&cStack_48.m_consume_operation);
    pvVar3 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
             ::consume_operation::unaligned_element_ptr(&cStack_48.m_consume_operation);
    iVar1 = (*pFVar2->m_align_invoke_destroy)(pvVar3,param_3);
    conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
    ::consume_operation::commit_nodestroy(&cStack_48);
    (this->m_queue).m_mutex.super___mutex_base._M_mutex.__size[4] = '\x01';
    (this->m_queue).m_mutex.super___mutex_base._M_mutex.__data.__lock = iVar1;
  }
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
  ::consume_operation::~consume_operation(&cStack_48);
  return (optional<int>)this;
}

Assistant:

optional<RET_VAL> try_consume_impl(std::false_type, PARAMS... i_params)
        {
            if (auto cons = m_queue.try_start_consume())
            {
                auto && result = cons.complete_type().align_invoke_destroy(
                  cons.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                cons.commit_nodestroy();
                return optional<RET_VAL>(std::move(result));
            }
            else
            {
                return optional<RET_VAL>();
            }
        }